

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall
merlin::graph::triangulate
          (graph *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *ordering)

{
  pointer puVar1;
  unsigned_long uVar2;
  pointer pmVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  size_t i;
  size_type sVar7;
  ulong uVar8;
  ulong uVar9;
  pointer peVar10;
  size_type __n;
  ulong uVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tmp;
  index ni;
  vector<unsigned_long,_std::allocator<unsigned_long>_> position;
  
  __n = (long)(ordering->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(ordering->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&position,__n,(allocator_type *)&tmp);
  puVar1 = (ordering->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
    position.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[puVar1[sVar7]] = sVar7;
  }
  for (sVar7 = 0; sVar7 != __n; sVar7 = sVar7 + 1) {
    uVar2 = (ordering->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[sVar7];
    uVar6 = position.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar2];
    pmVar3 = (this->m_adj).
             super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    tmp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tmp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tmp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (peVar10 = *(pointer *)
                    &pmVar3[uVar2].super_my_vector<merlin::edge_id>.
                     super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
        peVar10 !=
        *(pointer *)
         ((long)&pmVar3[uVar2].super_my_vector<merlin::edge_id>.
                 super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8);
        peVar10 = peVar10 + 1) {
      ni = peVar10->second;
      if (uVar6 < position.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[ni]) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&tmp,&ni);
      }
    }
    uVar6 = (ulong)((long)tmp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)tmp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3;
    iVar5 = (int)uVar6;
    iVar4 = 1;
    if (1 < iVar5) {
      iVar4 = iVar5;
    }
    uVar8 = 1;
    uVar11 = 0;
    while (uVar11 != iVar4 - 1) {
      for (uVar9 = uVar8; (uVar6 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1) {
        add_edge(this,tmp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar11],
                 tmp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9]);
      }
      uVar8 = uVar8 + 1;
      uVar11 = uVar11 + 1;
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&tmp.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&position.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void graph::triangulate(const std::vector<size_t>& ordering) {

	// set the position map
	size_t n = ordering.size();
	std::vector<size_t> position(n);
	for (size_t i = 0; i < n; ++i) {
		position[ordering[i]] = i;
	}

	// triangulate the graph
	for (size_t i = 0; i < n; ++i) {
		size_t var = ordering[i];
		size_t pos = position[var];

		const my_set<edge_id>& ns = neighbors(var);
		std::vector<size_t> tmp;
		for (my_set<edge_id>::const_iterator si = ns.begin(); si != ns.end(); ++si) {
			index ni = (*si).second;
			if (position[ni] > pos) {
				tmp.push_back(ni);
			}
		}

		// connect the earlier neighbors
		int m = (int)tmp.size();
		for (int j = 0; j < m-1; ++j) {
			for (int k = j+1; k < m; ++k) {
				add_edge(tmp[j], tmp[k]);
			}
		}
	}
}